

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_uninit(drmp3 *pMP3)

{
  long in_RDI;
  
  if (in_RDI != 0) {
    if (*(code **)(in_RDI + 0x1a28) == drmp3__on_read_stdio) {
      fclose(*(FILE **)(in_RDI + 0x1a38));
    }
    drmp3_free((void *)0x1072b2);
  }
  return;
}

Assistant:

void drmp3_uninit(drmp3* pMP3)
{
    if (pMP3 == NULL) {
        return;
    }

#ifndef DR_MP3_NO_STDIO
    if (pMP3->onRead == drmp3__on_read_stdio) {
        fclose((FILE*)pMP3->pUserData);
    }
#endif

    drmp3_free(pMP3->pData);
}